

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::convert(crunch *this,char *pCommand_line)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  param_desc *pParam_desc;
  pointer ppVar4;
  dynamic_string *this_00;
  char *pcVar5;
  int __fd;
  console *pcVar6;
  undefined1 local_490 [7];
  bool status;
  dynamic_string log_filename;
  param_map_const_iterator pStack_478;
  uint32 i_1;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_470;
  param_map_const_iterator it;
  undefined1 local_460 [8];
  param_desc desc;
  uint local_448;
  pixel_format fmt;
  uint32 i;
  undefined1 local_438 [8];
  vector<crnlib::command_line_params::param_desc> params;
  param_desc std_params [64];
  char *pCommand_line_local;
  crunch *this_local;
  
  this->m_num_processed = 0;
  this->m_num_failed = 0;
  this->m_num_succeeded = 0;
  this->m_num_skipped = 0;
  memcpy(&params.m_size,&DAT_00269030,0x400);
  crnlib::vector<crnlib::command_line_params::param_desc>::vector
            ((vector<crnlib::command_line_params::param_desc> *)local_438);
  crnlib::vector<crnlib::command_line_params::param_desc>::append
            ((vector<crnlib::command_line_params::param_desc> *)local_438,
             (param_desc *)&params.m_size,0x40);
  for (local_448 = 0; uVar2 = crnlib::pixel_format_helpers::get_num_formats(), local_448 < uVar2;
      local_448 = local_448 + 1) {
    desc._12_4_ = crnlib::pixel_format_helpers::get_pixel_format_by_index(local_448);
    local_460 = (undefined1  [8])crnlib::pixel_format_helpers::get_pixel_format_string(desc._12_4_);
    desc.m_pName._0_4_ = 0;
    desc.m_pName._4_1_ = 0;
    crnlib::vector<crnlib::command_line_params::param_desc>::push_back
              ((vector<crnlib::command_line_params::param_desc> *)local_438,(param_desc *)local_460)
    ;
  }
  uVar2 = crnlib::vector<crnlib::command_line_params::param_desc>::size
                    ((vector<crnlib::command_line_params::param_desc> *)local_438);
  pParam_desc = crnlib::vector<crnlib::command_line_params::param_desc>::get_ptr
                          ((vector<crnlib::command_line_params::param_desc> *)local_438);
  bVar1 = crnlib::command_line_params::parse(&this->m_params,pCommand_line,uVar2,pParam_desc,true);
  if (!bVar1) {
    this_local._7_1_ = false;
    it._M_node._4_4_ = 1;
    goto LAB_0010f085;
  }
  uVar2 = crnlib::command_line_params::get_num_params(&this->m_params);
  if (uVar2 == 0) {
    crnlib::console::error("No command line parameters specified!");
    print_usage();
    this_local._7_1_ = false;
    it._M_node._4_4_ = 1;
    goto LAB_0010f085;
  }
  bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"debug",0,false);
  if (bVar1) {
    crnlib::console::debug("Command line parameters:");
    local_470._M_node = (_Base_ptr)crnlib::command_line_params::begin(&this->m_params);
    while( true ) {
      pStack_478 = crnlib::command_line_params::end(&this->m_params);
      pcVar6 = (console *)&local_470;
      bVar1 = std::operator!=((_Self *)pcVar6,&stack0xfffffffffffffb88);
      if (!bVar1) break;
      crnlib::console::disable_crlf(pcVar6);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
               ::operator->(&local_470);
      pcVar5 = crnlib::dynamic_string::get_ptr(&ppVar4->first);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
               ::operator->(&local_470);
      uVar2 = crnlib::vector<crnlib::dynamic_string>::size(&(ppVar4->second).m_values);
      crnlib::console::debug("Key:\"%s\" Values (%u): ",pcVar5,(ulong)uVar2);
      log_filename.m_pStr._4_4_ = 0;
      while( true ) {
        uVar3 = log_filename.m_pStr._4_4_;
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->(&local_470);
        uVar2 = crnlib::vector<crnlib::dynamic_string>::size(&(ppVar4->second).m_values);
        if (uVar2 <= uVar3) break;
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->(&local_470);
        this_00 = crnlib::vector<crnlib::dynamic_string>::operator[]
                            (&(ppVar4->second).m_values,log_filename.m_pStr._4_4_);
        pcVar5 = crnlib::dynamic_string::get_ptr(this_00);
        crnlib::console::debug("\"%s\" ",pcVar5);
        log_filename.m_pStr._4_4_ = log_filename.m_pStr._4_4_ + 1;
      }
      pcVar6 = (console *)0x2296e6;
      crnlib::console::debug("\n");
      crnlib::console::enable_crlf(pcVar6);
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator++(&local_470);
    }
  }
  crnlib::dynamic_string::dynamic_string((dynamic_string *)local_490);
  __fd = 0x228ad4;
  bVar1 = crnlib::command_line_params::get_value_as_string
                    (&this->m_params,"logfile",0,(dynamic_string *)local_490,0);
  if (bVar1) {
    pcVar5 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_490);
    uVar3 = crnlib::cfile_stream::open(&this->m_log_stream,pcVar5,6,1);
    if ((uVar3 & 1) != 0) {
      pcVar5 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_490);
      __fd = (int)pcVar5;
      crnlib::console::printf("Appending output to log file \"%s\"");
      crnlib::console::set_log_stream((data_stream *)this);
      goto LAB_0010f007;
    }
    pcVar5 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_490);
    crnlib::console::error("Unable to open log file: \"%s\"",pcVar5);
    this_local._7_1_ = false;
  }
  else {
LAB_0010f007:
    this_local._7_1_ = convert(this);
    bVar1 = crnlib::data_stream::is_opened((data_stream *)this);
    if (bVar1) {
      crnlib::console::set_log_stream((data_stream *)0x0);
      crnlib::cfile_stream::close(&this->m_log_stream,__fd);
    }
  }
  it._M_node._4_4_ = 1;
  crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_490);
LAB_0010f085:
  crnlib::vector<crnlib::command_line_params::param_desc>::~vector
            ((vector<crnlib::command_line_params::param_desc> *)local_438);
  return this_local._7_1_;
}

Assistant:

bool convert(const char* pCommand_line)
    {
        m_num_processed = 0;
        m_num_failed = 0;
        m_num_succeeded = 0;
        m_num_skipped = 0;

        command_line_params::param_desc std_params[] =
        {
            { "file", 1, true },

            { "out", 1, false },
            { "outdir", 1, false },
            { "outsamedir", 0, false },
            { "deep", 0, false },
            { "fileformat", 1, false },

            { "helperThreads", 1, false },
            { "noprogress", 0, false },
            { "quiet", 0, false },
            { "ignoreerrors", 0, false },
            { "logfile", 1, false },

            { "q", 1, false },
            { "quality", 1, false },

            { "c", 1, false },
            { "s", 1, false },
            { "ca", 1, false },
            { "sa", 1, false },

            { "mipMode", 1, false },
            { "mipFilter", 1, false },
            { "gamma", 1, false },
            { "blurriness", 1, false },
            { "wrap", 0, false },
            { "renormalize", 0, false },
            { "rtopmip", 0, false },
            { "noprogress", 0, false },
            { "paramdebug", 0, false },
            { "debug", 0, false },
            { "quick", 0, false },
            { "imagestats", 0, false },
            { "nostats", 0, false },
            { "mipstats", 0, false },

            { "alphaThreshold", 1, false },
            { "uniformMetrics", 0, false },
            { "noAdaptiveBlocks", 0, false },
            { "compressor", 1, false },
            { "dxtQuality", 1, false },
            { "noendpointcaching", 0, false },
            { "grayscalesampling", 0, false },
            { "converttoluma", 0, false },
            { "setalphatoluma", 0, false },
            { "pause", 0, false },
            { "timestamp", 0, false },
            { "nooverwrite", 0, false },
            { "forcewrite", 0, false },
            { "recreate", 0, false },
            { "compare", 0, false },
            { "info", 0, false },
            { "forceprimaryencoding", 0, false },
            { "usetransparentindicesforblack", 0, false },
            { "usesourceformat", 0, false },

            { "rescalemode", 1, false },
            { "rescale", 2, false },
            { "relrescale", 2, false },
            { "clamp", 2, false },
            { "clampScale", 2, false },
            { "window", 4, false },

            { "maxmips", 1, false },
            { "minmipsize", 1, false },

            { "bitrate", 1, false },

            { "lzmastats", 0, false },
            { "split", 0, false },
            { "csvfile", 1, false },

            { "yflip", 0, false },
            { "unflip", 0, false },
        };

        crnlib::vector<command_line_params::param_desc> params;
        params.append(std_params, sizeof(std_params) / sizeof(std_params[0]));

        for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++)
        {
            pixel_format fmt = pixel_format_helpers::get_pixel_format_by_index(i);

            command_line_params::param_desc desc;
            desc.m_pName = pixel_format_helpers::get_pixel_format_string(fmt);
            desc.m_num_values = 0;
            desc.m_support_listing_file = false;
            params.push_back(desc);
        }

        if (!m_params.parse(pCommand_line, params.size(), params.get_ptr(), true))
        {
            return false;
        }

        if (!m_params.get_num_params())
        {
            console::error("No command line parameters specified!");

            print_usage();

            return false;
        }

#if 0
        if (m_params.get_count(""))
        {
            console::error("Unrecognized command line parameter: \"%s\"", m_params.get_value_as_string_or_empty("", 0).get_ptr());

            return false;
        }
#endif

        if (m_params.get_value_as_bool("debug"))
        {
            console::debug("Command line parameters:");
            for (command_line_params::param_map_const_iterator it = m_params.begin(); it != m_params.end(); ++it)
            {
                console::disable_crlf();
                console::debug("Key:\"%s\" Values (%u): ", it->first.get_ptr(), it->second.m_values.size());
                for (uint32 i = 0; i < it->second.m_values.size(); i++)
                {
                    console::debug("\"%s\" ", it->second.m_values[i].get_ptr());
                }
                console::debug("\n");
                console::enable_crlf();
            }
        }

        dynamic_string log_filename;
        if (m_params.get_value_as_string("logfile", 0, log_filename))
        {
            if (!m_log_stream.open(log_filename.get_ptr(), cDataStreamWritable | cDataStreamSeekable, true))
            {
                console::error("Unable to open log file: \"%s\"", log_filename.get_ptr());
                return false;
            }

            console::printf("Appending output to log file \"%s\"", log_filename.get_ptr());

            console::set_log_stream(&m_log_stream);
        }

        bool status = convert();

        if (m_log_stream.is_opened())
        {
            console::set_log_stream(nullptr);

            m_log_stream.close();
        }

        return status;
    }